

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

bool __thiscall
SmallDenseSet<TypePair,_TypePairHasher,_4U>::contains
          (SmallDenseSet<TypePair,_TypePairHasher,_4U> *this,TypePair *key)

{
  uint uVar1;
  TypeBase *pTVar2;
  TypeBase *pTVar3;
  uint uVar4;
  uint uVar5;
  byte bVar6;
  ulong in_R10;
  
  uVar1 = this->bucketCount;
  uVar5 = key->b->nameHash + key->a->nameHash;
  uVar4 = 0;
  do {
    bVar6 = (byte)in_R10;
    if (uVar1 == uVar4) {
LAB_0017f1b7:
      return (bool)(uVar4 < uVar1 & bVar6);
    }
    uVar5 = uVar5 & uVar1 - 1;
    pTVar2 = this->data[uVar5].a;
    pTVar3 = this->data[uVar5].b;
    if (pTVar2 == (TypeBase *)0x0 && pTVar3 == (TypeBase *)0x0) {
      bVar6 = 0;
      goto LAB_0017f1b7;
    }
    in_R10 = (ulong)pTVar2 ^ (ulong)key->a;
    if (pTVar3 == key->b && in_R10 == 0) {
      bVar6 = 1;
      goto LAB_0017f1b7;
    }
    uVar5 = uVar5 + uVar4 + 1;
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

bool contains(const Key& key)
	{
		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Key &item = data[bucket];

			if(item == Key())
				return false;

			if(item == key)
				return true;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		return false;
	}